

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# signal-ptr.h
# Opt level: O3

void __thiscall
dynamicgraph::SignalPtr<double,_int>::setConstantDefault(SignalPtr<double,_int> *this)

{
  undefined8 *puVar1;
  _func_int *p_Var2;
  int iVar3;
  undefined4 extraout_var;
  undefined8 *puVar4;
  
  iVar3 = (*this->_vptr_SignalPtr[0xd])();
  p_Var2 = this->_vptr_SignalPtr[-3];
  *(undefined4 *)(&this->field_0x30 + (long)p_Var2) = 0;
  puVar1 = (undefined8 *)(&this->field_0x40 + (long)p_Var2);
  puVar4 = (undefined8 *)(&this->field_0x38 + (long)p_Var2);
  if (*(undefined8 **)(&this->field_0x48 + (long)p_Var2) ==
      (undefined8 *)(&this->field_0x38 + (long)p_Var2)) {
    puVar4 = puVar1;
  }
  *puVar4 = *(undefined8 *)CONCAT44(extraout_var,iVar3);
  *(undefined1 *)(puVar1 + 2) = 1;
  puVar1[1] = puVar4;
  *(undefined1 *)((long)puVar1 + -0x14) = 1;
  this->modeNoThrow = true;
  return;
}

Assistant:

virtual inline void setConstantDefault() { setConstantDefault(accessCopy()); }